

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int cm_zlib_inflateValidate(z_streamp strm,int check)

{
  internal_state *piVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = inflateStateCheck(strm);
  iVar3 = -2;
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if ((check == 0) || (*(uint *)&piVar1->pending_buf == 0)) {
      *(byte *)&piVar1->pending_buf = *(byte *)&piVar1->pending_buf & 0xfb;
    }
    else {
      *(uint *)&piVar1->pending_buf = *(uint *)&piVar1->pending_buf | 4;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ZEXPORT inflateValidate(strm, check)
z_streamp strm;
int check;
{
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (check && state->wrap)
        state->wrap |= 4;
    else
        state->wrap &= ~4;
    return Z_OK;
}